

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::ParseableFunctionInfo::SetSourceInfo(ParseableFunctionInfo *this,uint sourceIndex)

{
  code *pcVar1;
  bool bVar2;
  FunctionBody *this_00;
  undefined4 *puVar3;
  uint sourceIndex_local;
  ParseableFunctionInfo *this_local;
  
  if ((char)(this->super_FunctionProxy).field_0x47 < '\0') {
    if (this->m_sourceIndex != sourceIndex) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xbbf,"(this->m_sourceIndex == sourceIndex)",
                                  "Mismatched source index");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  else {
    this->m_sourceIndex = sourceIndex;
    this->m_cchStartOffset = 0;
    this->m_cchLength = 0;
    this->m_lineNumber = 0;
    this->m_columnNumber = 0;
    this->m_cbStartOffset = 0;
    this->m_cbLength = 0;
    (this->super_FunctionProxy).field_0x47 = (this->super_FunctionProxy).field_0x47 & 0x7f | 0x80;
    bVar2 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
    if (bVar2) {
      this_00 = FunctionProxy::GetFunctionBody(&this->super_FunctionProxy);
      FunctionBody::FinishSourceInfo(this_00);
    }
  }
  return;
}

Assistant:

void ParseableFunctionInfo::SetSourceInfo(uint sourceIndex)
    {
        // TODO (michhol): how do we want to handle wasm source?
        if (!m_utf8SourceHasBeenSet)
        {
            this->m_sourceIndex = sourceIndex;
            this->m_cchStartOffset = 0;
            this->m_cchLength = 0;
            this->m_lineNumber = 0;
            this->m_columnNumber = 0;

            this->m_cbStartOffset = 0;
            this->m_cbLength = 0;

            this->m_utf8SourceHasBeenSet = true;

            if (this->IsFunctionBody())
            {
                this->GetFunctionBody()->FinishSourceInfo();
            }
        }
#if DBG
        else
        {
            AssertMsg(this->m_sourceIndex == sourceIndex, "Mismatched source index");
        }
#endif
    }